

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintForceModifier.cpp
# Opt level: O0

void __thiscall
OpenMD::RestraintForceModifier::~RestraintForceModifier(RestraintForceModifier *this)

{
  SimInfo *pSVar1;
  RestWriter *in_RDI;
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *unaff_retaddr;
  
  in_RDI->info_ = (SimInfo *)&PTR__RestraintForceModifier_004fc5b0;
  Utils::deletePointers<std::vector<OpenMD::Restraint*,std::allocator<OpenMD::Restraint*>>>
            ((vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_> *)unaff_retaddr);
  pSVar1 = in_RDI[7].info_;
  if (pSVar1 != (SimInfo *)0x0) {
    RestWriter::~RestWriter(in_RDI);
    operator_delete(pSVar1,0x18);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  std::
  vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
  ::~vector((vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
             *)unaff_retaddr);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)unaff_retaddr)
  ;
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::~vector(unaff_retaddr);
  std::vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>::~vector
            ((vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_> *)unaff_retaddr);
  ForceModifier::~ForceModifier((ForceModifier *)in_RDI);
  return;
}

Assistant:

RestraintForceModifier::~RestraintForceModifier() {
    Utils::deletePointers(restraints_);

    delete restOut;
  }